

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
visitDefault<slang::syntax::ParameterPortListSyntax_const&>
          (SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this,
          ParameterPortListSyntax *node)

{
  bool bVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  Token token;
  SyntaxNode *child;
  uint32_t i;
  ParameterPortListSyntax *node_local;
  SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this_local;
  
  for (child._4_4_ = 0; sVar2 = SyntaxNode::getChildCount(&node->super_SyntaxNode),
      child._4_4_ < sVar2; child._4_4_ = child._4_4_ + 1) {
    token.info = (Info *)SyntaxNode::childNode(&node->super_SyntaxNode,(ulong)child._4_4_);
    if ((SyntaxNode *)token.info == (SyntaxNode *)0x0) {
      _local_38 = SyntaxNode::childToken(&node->super_SyntaxNode,(ulong)child._4_4_);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)local_38);
      if (bVar1) {
        parsing::anon_unknown_4::MetadataVisitor::visitToken((MetadataVisitor *)this,_local_38);
      }
    }
    else {
      SyntaxNode::visit<slang::parsing::(anonymous_namespace)::MetadataVisitor>
                ((SyntaxNode *)token.info,(MetadataVisitor *)this);
    }
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }